

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O1

JsonnetVm * jsonnet_make(void)

{
  JsonnetVm *this;
  
  this = (JsonnetVm *)operator_new(0xf0);
  JsonnetVm::JsonnetVm(this);
  return this;
}

Assistant:

JsonnetVm *jsonnet_make(void)
{
    TRY
        return new JsonnetVm();
    CATCH("jsonnet_make")
    return nullptr;
}